

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deltatimeinfo.cpp
# Opt level: O3

void __thiscall hbm::streaming::deltaTimeInfo::setDelta(deltaTimeInfo *this,Value *params)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  UInt UVar4;
  UInt UVar5;
  UInt UVar6;
  UInt UVar7;
  Value *pVVar8;
  Value *pVVar9;
  ulong uVar10;
  ostream *poVar11;
  runtime_error *this_00;
  ulong uVar12;
  Value value;
  Value local_120;
  Value local_f8;
  Value local_d0;
  Value local_a8;
  Value local_80;
  Value local_58;
  
  Json::Value::Value(&local_120,nullValue);
  pVVar8 = Json::Value::operator[](params,"samples");
  Json::Value::Value(&local_58,pVVar8);
  Json::Value::operator=(&local_120,&local_58);
  Json::Value::~Value(&local_58);
  bVar3 = Json::Value::isNull(&local_120);
  UVar4 = 1;
  if (!bVar3) {
    UVar4 = Json::Value::asUInt(&local_120);
    if (UVar4 == 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"samples must be > 0");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  pVVar8 = Json::Value::operator[](params,"delta");
  pVVar9 = Json::Value::operator[](pVVar8,"type");
  Json::Value::Value(&local_80,"ntp");
  bVar3 = Json::Value::operator==(pVVar9,&local_80);
  Json::Value::~Value(&local_80);
  if (bVar3) {
    pVVar9 = Json::Value::operator[](pVVar8,"seconds");
    Json::Value::Value(&local_a8,pVVar9);
    Json::Value::operator=(&local_120,&local_a8);
    Json::Value::~Value(&local_a8);
    bVar3 = Json::Value::isNull(&local_120);
    UVar5 = 0;
    if (!bVar3) {
      UVar5 = Json::Value::asUInt(&local_120);
    }
    pVVar9 = Json::Value::operator[](pVVar8,"fraction");
    Json::Value::Value(&local_d0,pVVar9);
    Json::Value::operator=(&local_120,&local_d0);
    Json::Value::~Value(&local_d0);
    bVar3 = Json::Value::isNull(&local_120);
    UVar6 = 0;
    if (!bVar3) {
      UVar6 = Json::Value::asUInt(&local_120);
    }
    pVVar8 = Json::Value::operator[](pVVar8,"subFraction");
    Json::Value::Value(&local_f8,pVVar8);
    Json::Value::operator=(&local_120,&local_f8);
    Json::Value::~Value(&local_f8);
    bVar3 = Json::Value::isNull(&local_120);
    if (bVar3) {
      UVar7 = 0;
    }
    else {
      UVar7 = Json::Value::asUInt(&local_120);
    }
  }
  else {
    UVar7 = 0;
    UVar6 = 0;
    UVar5 = 0;
  }
  uVar12 = (ulong)UVar4;
  uVar10 = CONCAT44(UVar5,UVar6) / uVar12;
  this->m_deltaNtpTimestamp = uVar10;
  this->m_deltaSubFraction =
       ((uVar10 % uVar12 << 0x20) / uVar12 & 0xffffffff) + (ulong)UVar7 / (ulong)UVar4;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"setDelta",8);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"seconds = ",10);
  poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  *(uint *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x18) =
       *(uint *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x18) & 0xffffffb5 | 8;
  std::__ostream_insert<char,std::char_traits<char>>(poVar11," (0x",4);
  poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,")",1);
  lVar1 = *(long *)poVar11;
  lVar2 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar11 + lVar2 + 0x18) = *(uint *)(poVar11 + lVar2 + 0x18) & 0xffffffb5 | 2;
  std::ios::widen((char)*(undefined8 *)(lVar1 + -0x18) + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"fraction = ",0xb);
  poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  *(uint *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x18) =
       *(uint *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x18) & 0xffffffb5 | 8;
  std::__ostream_insert<char,std::char_traits<char>>(poVar11," (0x",4);
  poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,")",1);
  lVar1 = *(long *)poVar11;
  lVar2 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar11 + lVar2 + 0x18) = *(uint *)(poVar11 + lVar2 + 0x18) & 0xffffffb5 | 2;
  std::ios::widen((char)*(undefined8 *)(lVar1 + -0x18) + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"subFraction = ",0xe);
  poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  *(uint *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x18) =
       *(uint *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x18) & 0xffffffb5 | 8;
  std::__ostream_insert<char,std::char_traits<char>>(poVar11," (0x",4);
  poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,")",1);
  lVar1 = *(long *)poVar11;
  lVar2 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar11 + lVar2 + 0x18) = *(uint *)(poVar11 + lVar2 + 0x18) & 0xffffffb5 | 2;
  std::ios::widen((char)*(undefined8 *)(lVar1 + -0x18) + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  Json::Value::~Value(&local_120);
  return;
}

Assistant:

void deltaTimeInfo::setDelta(const Json::Value& params)
		{
			uint32_t samples = 1;
			uint32_t seconds = 0;
			uint32_t fraction = 0;
			uint32_t subFraction = 0;

			Json::Value value;

			value = params["samples"];
			if(value.isNull()==false) {
				samples = value.asUInt();
				if(samples==0) {
					throw std::runtime_error("samples must be > 0");
				}
			}

			const Json::Value& timeObject = params["delta"];
			if(timeObject["type"]=="ntp") {
				value = timeObject["seconds"];
				if(value.isNull()==false) {
					seconds = value.asUInt();
				}

				value = timeObject["fraction"];
				if(value.isNull()==false) {
					fraction = value.asUInt();
				}

				value = timeObject["subFraction"];
				if(value.isNull()==false) {
					subFraction = value.asUInt();
				}
			}
			uint64_t ntpTimestamp = seconds;
			ntpTimestamp <<= 32;
			ntpTimestamp |= fraction;



			// we are loosing precision here. In order to compensate this, we calculate a correction to use.
			m_deltaNtpTimestamp = ntpTimestamp/samples;
			m_deltaSubFraction = subFraction/samples;

			// determine remainder and calculate sub fraction from it.
			uint64_t remainder = m_deltaNtpTimestamp%samples;
			remainder <<= 32;
			remainder /= samples;
			m_deltaSubFraction += static_cast < uint32_t > (remainder & 0xffffffff);

			std::cout << __FUNCTION__ << std::endl;
			std::cout << "seconds = " << seconds << std::hex << " (0x" << seconds << ")" << std::dec << std::endl;
			std::cout << "fraction = " << fraction << std::hex << " (0x" << fraction << ")" << std::dec << std::endl;
			std::cout << "subFraction = " << subFraction << std::hex << " (0x" << subFraction << ")" << std::dec << std::endl;
		}